

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O0

void ssh2_bpp_free_outgoing_crypto(ssh2_bpp_state *s)

{
  ssh2_bpp_state *s_local;
  
  if ((s->out).mac != (ssh2_mac *)0x0) {
    ssh2_mac_free((s->out).mac);
  }
  if ((s->out).cipher != (ssh_cipher *)0x0) {
    ssh_cipher_free((s->out).cipher);
  }
  if (s->out_comp != (ssh_compressor *)0x0) {
    ssh_compressor_free(s->out_comp);
  }
  return;
}

Assistant:

static void ssh2_bpp_free_outgoing_crypto(struct ssh2_bpp_state *s)
{
    /*
     * We must free the MAC before the cipher, because sometimes the
     * MAC is not actually separately allocated but just a different
     * facet of the same object as the cipher, in which case
     * ssh2_mac_free does nothing and ssh_cipher_free does the actual
     * freeing. So if we freed the cipher first and then tried to
     * dereference the MAC's vtable pointer to find out how to free
     * that too, we'd be accessing freed memory.
     */
    if (s->out.mac)
        ssh2_mac_free(s->out.mac);
    if (s->out.cipher)
        ssh_cipher_free(s->out.cipher);
    if (s->out_comp)
        ssh_compressor_free(s->out_comp);
}